

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_subsample_hbd_420_8x16_ssse3(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  
  uVar2 = 0xffffffffffffffc0;
  do {
    puVar1 = cfl_type + input_stride;
    auVar3._0_2_ = *puVar1 + *cfl_type;
    auVar3._2_2_ = puVar1[1] + cfl_type[1];
    auVar3._4_2_ = puVar1[2] + cfl_type[2];
    auVar3._6_2_ = puVar1[3] + cfl_type[3];
    auVar3._8_2_ = puVar1[4] + cfl_type[4];
    auVar3._10_2_ = puVar1[5] + cfl_type[5];
    auVar3._12_2_ = puVar1[6] + cfl_type[6];
    auVar3._14_2_ = puVar1[7] + cfl_type[7];
    auVar3 = phaddw(auVar3,auVar3);
    *(ulong *)((long)output_q3 + uVar2 + 0x40) =
         CONCAT26(auVar3._6_2_ * 2,
                  CONCAT24(auVar3._4_2_ * 2,CONCAT22(auVar3._2_2_ * 2,auVar3._0_2_ * 2)));
    uVar2 = uVar2 + 0x40;
    cfl_type = cfl_type + input_stride * 2;
  } while (uVar2 < 0x1c0);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + (height >> 1) * CFL_BUF_LINE;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      sum = _mm_hadd_epi16(sum, sum);
      *((int *)pred_buf_q3) = _mm_cvtsi128_si32(_mm_add_epi16(sum, sum));
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      const __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      if (width == 8) {
        sum = _mm_hadd_epi16(sum, sum);
        _mm_storel_epi64((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        sum = _mm_hadd_epi16(sum, _mm_add_epi16(top_1, bot_1));
        _mm_storeu_si128((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i bot_2 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i bot_3 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 3);
          const __m128i sum_2 = _mm_add_epi16(top_2, bot_2);
          const __m128i sum_3 = _mm_add_epi16(top_3, bot_3);
          __m128i next_sum = _mm_hadd_epi16(sum_2, sum_3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1,
                           _mm_add_epi16(next_sum, next_sum));
        }
      }
    }
    input += luma_stride;
  } while ((pred_buf_q3 += CFL_BUF_LINE) < end);
}